

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResamplerModel.cpp
# Opt level: O2

FloatSampleProvider *
SRCTools::ResamplerModel::createResamplerModel
          (FloatSampleProvider *source,double sourceSampleRate,double targetSampleRate,
          Quality quality)

{
  IIR2xInterpolator *this;
  FloatSampleProvider *pFVar1;
  FloatSampleProvider *pFVar2;
  ResamplerStage *pRVar3;
  LinearResampler *this_00;
  double dVar4;
  double dVar5;
  double dVar6;
  
  if ((sourceSampleRate != targetSampleRate) || (NAN(sourceSampleRate) || NAN(targetSampleRate))) {
    pFVar1 = source;
    if (quality == FASTEST) {
      pFVar2 = (FloatSampleProvider *)operator_new(0x8028);
      this_00 = (LinearResampler *)operator_new(0x20);
      LinearResampler::LinearResampler(this_00,sourceSampleRate,targetSampleRate);
      source = pFVar2;
    }
    else {
      dVar4 = IIRResampler::getPassbandFractionForQuality(quality);
      if (targetSampleRate <= sourceSampleRate) {
        dVar5 = targetSampleRate + targetSampleRate;
        if ((dVar5 != sourceSampleRate) || (NAN(dVar5) || NAN(sourceSampleRate))) {
          dVar6 = ceil((dVar5 * 256.0) / sourceSampleRate);
          pRVar3 = SincResampler::createSincResampler
                             (sourceSampleRate,dVar5,targetSampleRate * 0.5 * dVar4,
                              targetSampleRate * 1.5,106.0,(uint)(long)dVar6);
          pFVar1 = (FloatSampleProvider *)operator_new(0x8028);
          pFVar1[1]._vptr_FloatSampleProvider = (_func_int **)pRVar3;
          pFVar1[2]._vptr_FloatSampleProvider = (_func_int **)source;
          pFVar1[0x1003]._vptr_FloatSampleProvider = (_func_int **)(pFVar1 + 3);
          *(undefined4 *)&pFVar1[0x1004]._vptr_FloatSampleProvider = 0;
          pFVar1->_vptr_FloatSampleProvider =
               (_func_int **)&PTR__InternalResamplerCascadeStage_001aba48;
          this_00 = (LinearResampler *)operator_new(0x28);
          IIR2xDecimator::IIR2xDecimator((IIR2xDecimator *)this_00,quality);
        }
        else {
          this_00 = (LinearResampler *)operator_new(0x28);
          IIR2xDecimator::IIR2xDecimator((IIR2xDecimator *)this_00,quality);
        }
      }
      else {
        this = (IIR2xInterpolator *)operator_new(0x38);
        IIR2xInterpolator::IIR2xInterpolator(this,quality);
        pFVar1 = (FloatSampleProvider *)operator_new(0x8028);
        pFVar1[1]._vptr_FloatSampleProvider = (_func_int **)this;
        pFVar1[2]._vptr_FloatSampleProvider = (_func_int **)source;
        pFVar1[0x1003]._vptr_FloatSampleProvider = (_func_int **)(pFVar1 + 3);
        *(undefined4 *)&pFVar1[0x1004]._vptr_FloatSampleProvider = 0;
        pFVar1->_vptr_FloatSampleProvider =
             (_func_int **)&PTR__InternalResamplerCascadeStage_001aba48;
        dVar5 = sourceSampleRate + sourceSampleRate;
        if ((dVar5 == targetSampleRate) && (!NAN(dVar5) && !NAN(targetSampleRate))) {
          return pFVar1;
        }
        this_00 = (LinearResampler *)
                  SincResampler::createSincResampler
                            (dVar5,targetSampleRate,sourceSampleRate * 0.5 * dVar4,
                             sourceSampleRate * 1.5,106.0,0x80);
      }
      source = (FloatSampleProvider *)operator_new(0x8028);
    }
    source[1]._vptr_FloatSampleProvider = (_func_int **)this_00;
    source[2]._vptr_FloatSampleProvider = (_func_int **)pFVar1;
    source[0x1003]._vptr_FloatSampleProvider = (_func_int **)(source + 3);
    *(undefined4 *)&source[0x1004]._vptr_FloatSampleProvider = 0;
    source->_vptr_FloatSampleProvider = (_func_int **)&PTR__InternalResamplerCascadeStage_001aba48;
  }
  return source;
}

Assistant:

FloatSampleProvider &ResamplerModel::createResamplerModel(FloatSampleProvider &source, double sourceSampleRate, double targetSampleRate, Quality quality) {
	if (sourceSampleRate == targetSampleRate) {
		return source;
	}
	if (quality == FASTEST) {
		return *new InternalResamplerCascadeStage(source, *new LinearResampler(sourceSampleRate, targetSampleRate));
	}
	const IIRResampler::Quality iirQuality = static_cast<IIRResampler::Quality>(quality);
	const double iirPassbandFraction = IIRResampler::getPassbandFractionForQuality(iirQuality);
	if (sourceSampleRate < targetSampleRate) {
		ResamplerStage *iir2xInterpolator = new IIR2xInterpolator(iirQuality);
		FloatSampleProvider &iir2xInterpolatorStage = *new InternalResamplerCascadeStage(source, *iir2xInterpolator);

		if (2.0 * sourceSampleRate == targetSampleRate) {
			return iir2xInterpolatorStage;
		}

		double passband = 0.5 * sourceSampleRate * iirPassbandFraction;
		double stopband = 1.5 * sourceSampleRate;
		ResamplerStage *sincResampler = SincResampler::createSincResampler(2.0 * sourceSampleRate, targetSampleRate, passband, stopband, DEFAULT_DB_SNR, DEFAULT_WINDOWED_SINC_MAX_UPSAMPLE_FACTOR);
		return *new InternalResamplerCascadeStage(iir2xInterpolatorStage, *sincResampler);
	}

	if (sourceSampleRate == 2.0 * targetSampleRate) {
		ResamplerStage *iir2xDecimator = new IIR2xDecimator(iirQuality);
		return *new InternalResamplerCascadeStage(source, *iir2xDecimator);
	}

	double passband = 0.5 * targetSampleRate * iirPassbandFraction;
	double stopband = 1.5 * targetSampleRate;
	double sincOutSampleRate = 2.0 * targetSampleRate;
	const unsigned int maxUpsampleFactor = static_cast<unsigned int>(ceil(DEFAULT_WINDOWED_SINC_MAX_DOWNSAMPLE_FACTOR * sincOutSampleRate / sourceSampleRate));
	ResamplerStage *sincResampler = SincResampler::createSincResampler(sourceSampleRate, sincOutSampleRate, passband, stopband, DEFAULT_DB_SNR, maxUpsampleFactor);
	FloatSampleProvider &sincResamplerStage = *new InternalResamplerCascadeStage(source, *sincResampler);

	ResamplerStage *iir2xDecimator = new IIR2xDecimator(iirQuality);
	return *new InternalResamplerCascadeStage(sincResamplerStage, *iir2xDecimator);
}